

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::ChooseConfigCase::fillDontCare
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes)

{
  pointer ppVar1;
  bool bVar2;
  long lVar3;
  int ndx;
  long lVar4;
  pair<unsigned_int,_int> local_30;
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    ppVar1 = (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar2 = false;
    for (lVar3 = 0;
        (long)(attributes->
              super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3 != lVar3;
        lVar3 = lVar3 + 1) {
      bVar2 = (bool)(bVar2 | ppVar1[lVar3].first == fillDontCare::dontCareAttributes[lVar4]);
    }
    if (!bVar2) {
      local_30 = (pair<unsigned_int,_int>)
                 ((ulong)fillDontCare::dontCareAttributes[lVar4] | 0xffffffff00000000);
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<std::pair<unsigned_int,int>>
                ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
                 attributes,&local_30);
    }
  }
  return;
}

Assistant:

void fillDontCare (std::vector<std::pair<EGLenum, EGLint> >& attributes)
	{
		static const EGLenum dontCareAttributes[] =
		{
			EGL_TRANSPARENT_TYPE,
			EGL_COLOR_BUFFER_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SURFACE_TYPE
		};

		// Fill appropriate unused attributes with EGL_DONT_CARE
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(dontCareAttributes); ndx++)
		{
			bool found = false;
			for (size_t findNdx = 0; findNdx < attributes.size(); findNdx++)
				if (attributes[findNdx].first == dontCareAttributes[ndx]) found = true;

			if (!found) attributes.push_back(std::make_pair(dontCareAttributes[ndx], EGL_DONT_CARE));
		}
	}